

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O3

bool __thiscall QCss::Parser::parseExpr(Parser *this,QList<QCss::Value> *values)

{
  bool bVar1;
  bool bVar2;
  long in_FS_OFFSET;
  anon_union_24_3_e3d07ef4_for_data local_80;
  undefined8 local_68;
  Value local_60;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_60._0_8_ = 0xaaaaaaaa00000000;
  local_60.variant.d.data.shared = (PrivateShared *)0x0;
  local_60.variant.d.data._8_8_ = 0;
  local_60.variant.d.data._16_8_ = 0;
  local_60.variant.d._24_8_ = 2;
  bVar1 = parseTerm(this,&local_60);
  bVar2 = false;
  if (bVar1) {
    QtPrivate::QMovableArrayOps<QCss::Value>::emplace<QCss::Value_const&>
              ((QMovableArrayOps<QCss::Value> *)values,(values->d).size,&local_60);
    QList<QCss::Value>::end(values);
    while( true ) {
      local_80.shared = (PrivateShared *)0x0;
      local_80._8_8_ = 0;
      local_80._16_8_ = 0;
      local_68 = 2;
      local_60._0_8_ = local_60._0_8_ & 0xffffffff00000000;
      ::QVariant::operator=(&local_60.variant,(QVariant *)&local_80);
      ::QVariant::~QVariant((QVariant *)&local_80);
      parseNextOperator(this,&local_60);
      if (local_60.type != Unknown) {
        QtPrivate::QMovableArrayOps<QCss::Value>::emplace<QCss::Value_const&>
                  ((QMovableArrayOps<QCss::Value> *)values,(values->d).size,&local_60);
        QList<QCss::Value>::end(values);
      }
      bVar2 = testTerm(this);
      if (!bVar2) break;
      local_80.shared = (PrivateShared *)0x0;
      local_80._8_8_ = 0;
      local_80._16_8_ = 0;
      local_68 = 2;
      local_60._0_8_ = local_60._0_8_ & 0xffffffff00000000;
      ::QVariant::operator=(&local_60.variant,(QVariant *)&local_80);
      ::QVariant::~QVariant((QVariant *)&local_80);
      bVar1 = parseTerm(this,&local_60);
      if (!bVar1) break;
      QtPrivate::QMovableArrayOps<QCss::Value>::emplace<QCss::Value_const&>
                ((QMovableArrayOps<QCss::Value> *)values,(values->d).size,&local_60);
      QList<QCss::Value>::end(values);
    }
    bVar2 = !bVar2;
  }
  ::QVariant::~QVariant(&local_60.variant);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool Parser::parseExpr(QList<Value> *values)
{
    Value val;
    if (!parseTerm(&val)) return false;
    values->append(val);
    bool onceMore;
    do {
        onceMore = false;
        val = Value();
        if (!parseNextOperator(&val)) return false;
        if (val.type != QCss::Value::Unknown)
            values->append(val);
        if (testTerm()) {
            onceMore = true;
            val = Value();
            if (!parseTerm(&val)) return false;
            values->append(val);
        }
    } while (onceMore);
    return true;
}